

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_messages_proto3.upb.h
# Opt level: O2

double protobuf_test_messages_proto3_TestAllTypesProto3_optional_double
                 (protobuf_test_messages_proto3_TestAllTypesProto3 *msg)

{
  bool bVar1;
  double ret;
  double default_val;
  upb_MiniTableField field;
  double local_28;
  double local_20;
  upb_MiniTableField local_18;
  
  local_20 = 0.0;
  local_18.number_dont_copy_me__upb_internal_use_only = 0xc;
  local_18.offset_dont_copy_me__upb_internal_use_only = 0xf8;
  local_18.presence = 0;
  local_18.submsg_index_dont_copy_me__upb_internal_use_only = 0xffff;
  local_18.descriptortype_dont_copy_me__upb_internal_use_only = '\x01';
  local_18.mode_dont_copy_me__upb_internal_use_only = 0xc2;
  bVar1 = _upb_MiniTableField_DataIsZero_dont_copy_me__upb_internal_use_only(&local_18,&local_20);
  if ((!bVar1) &&
     (bVar1 = upb_Message_HasBaseField(&msg->base_dont_copy_me__upb_internal_use_only,&local_18),
     !bVar1)) {
    return local_20;
  }
  _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only
            (&local_18,&local_28,
             (void *)((long)&(msg->base_dont_copy_me__upb_internal_use_only).field_0 +
                     ((ulong)local_18._0_8_ >> 0x20 & 0xffff)));
  return local_28;
}

Assistant:

UPB_INLINE double protobuf_test_messages_proto3_TestAllTypesProto3_optional_double(const protobuf_test_messages_proto3_TestAllTypesProto3* msg) {
  double default_val = 0;
  double ret;
  const upb_MiniTableField field = {12, UPB_SIZE(608, 248), 0, kUpb_NoSub, 1, (int)kUpb_FieldMode_Scalar | ((int)kUpb_FieldRep_8Byte << kUpb_FieldRep_Shift)};
  _upb_Message_GetNonExtensionField(UPB_UPCAST(msg), &field,
                                    &default_val, &ret);
  return ret;
}